

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O0

bool bitmap_operation::BlackGrayScaleImage(void)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  Image loaded;
  Image original;
  string *in_stack_000003a8;
  undefined7 in_stack_fffffffffffffee8;
  uint8_t in_stack_fffffffffffffeef;
  undefined2 in_stack_fffffffffffffef4;
  uint8_t in_stack_fffffffffffffef6;
  uint8_t in_stack_fffffffffffffef7;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  allocator local_d9;
  string local_d8 [32];
  ImageTemplate<unsigned_char> local_b8;
  allocator local_89;
  string local_88 [88];
  ImageTemplate<unsigned_char> local_30;
  byte local_1;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
             ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef7,in_stack_fffffffffffffef6);
  Unit_Test::blackImage((Image *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x185407);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"bitmap.bmp",&local_89);
  Bitmap_Operation::Save
            ((string *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Image *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"bitmap.bmp",&local_d9);
  Bitmap_Operation::Load(in_stack_000003a8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  remove("bitmap.bmp");
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_b8);
  if (uVar4 == uVar5) {
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_b8);
    if (uVar4 == uVar5) {
      bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_30);
      uVar6 = (uint)bVar1;
      bVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_b8);
      if ((uVar6 == bVar2) &&
         (bVar3 = Unit_Test::verifyImage
                            ((Image *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(
                                                  in_stack_fffffffffffffef4,uVar6))),
                             in_stack_fffffffffffffeef), bVar3)) {
        local_1 = 1;
        goto LAB_00185670;
      }
    }
  }
  local_1 = 0;
LAB_00185670:
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x18567a);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x185687);
  return (bool)(local_1 & 1);
}

Assistant:

bool BlackGrayScaleImage()
    {
        const PenguinV_Image::Image original = Unit_Test::blackImage();
        Bitmap_Operation::Save( "bitmap.bmp", original );

        const PenguinV_Image::Image loaded = Bitmap_Operation::Load( "bitmap.bmp" );
        remove("bitmap.bmp");

        if( original.height() != loaded.height() || original.width() != loaded.width() ||
            original.colorCount() != loaded.colorCount() || !Unit_Test::verifyImage( loaded, 0u ) )
            return false;

        return true;
    }